

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip38.c
# Opt level: O2

void aes_enc_impl(uchar *src,uchar *xor,uchar *key,uchar *bytes_out)

{
  size_t i;
  long lVar1;
  uchar plaintext [16];
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    plaintext[lVar1] = xor[lVar1] ^ src[lVar1];
  }
  wally_aes(key,0x20,plaintext,0x10,1,bytes_out,0x10);
  wally_clear(plaintext,0x10);
  return;
}

Assistant:

static void aes_enc_impl(const unsigned char *src, const unsigned char *xor,
                         const unsigned char *key, unsigned char *bytes_out)
{
    unsigned char plaintext[AES_BLOCK_LEN];
    size_t i;

    for (i = 0; i < sizeof(plaintext); ++i)
        plaintext[i] = src[i] ^ xor[i];

    wally_aes(key, AES_KEY_LEN_256, plaintext, AES_BLOCK_LEN,
              AES_FLAG_ENCRYPT, bytes_out, AES_BLOCK_LEN);

    wally_clear(plaintext, sizeof(plaintext));
}